

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * __thiscall
duckdb::ComplexJSON::GetValueRecursive_abi_cxx11_
          (string *__return_storage_ptr__,ComplexJSON *this,ComplexJSON *child)

{
  yyjson_val_pool *pool;
  yyjson_alc *alc;
  yyjson_str_pool *pool_00;
  _Hash_node_base *__src;
  _Hash_node_base *__n;
  ulong uVar1;
  pointer pcVar2;
  _Alloc_hider __src_00;
  size_type __n_00;
  bool bVar3;
  yyjson_mut_doc *this_00;
  type this_01;
  yyjson_mut_val *pyVar4;
  yyjson_mut_doc *extraout_RDX;
  yyjson_mut_doc *extraout_RDX_00;
  ComplexJSON *child_00;
  yyjson_mut_doc *extraout_RDX_01;
  yyjson_mut_doc *extraout_RDX_02;
  yyjson_mut_doc *pyVar5;
  yyjson_mut_doc *extraout_RDX_03;
  yyjson_mut_doc *extraout_RDX_04;
  yyjson_mut_doc *extraout_RDX_05;
  char *pcVar6;
  _Alloc_hider _Var7;
  _Hash_node_base *p_Var8;
  yyjson_mut_val *pyVar9;
  yyjson_mut_val *pyVar10;
  string value_str;
  string local_50;
  
  if (this->is_object == true) {
    this_00 = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
    pyVar5 = extraout_RDX;
    _Var7._M_p = (pointer)(ulong *)0x0;
    if (this_00 != (yyjson_mut_doc *)0x0) {
      GetValueRecursive_abi_cxx11_();
      pyVar5 = extraout_RDX_00;
      _Var7._M_p = local_50._M_dataplus._M_p;
    }
    p_Var8 = (this->obj_value)._M_h._M_before_begin._M_nxt;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      pool = &this_00->val_pool;
      alc = &this_00->alc;
      pool_00 = &this_00->str_pool;
      do {
        if (this_00 == (yyjson_mut_doc *)0x0) {
          pyVar10 = (yyjson_mut_val *)0x0;
        }
        else {
          __src = p_Var8[1]._M_nxt;
          pyVar10 = (yyjson_mut_val *)0x0;
          if (__src != (_Hash_node_base *)0x0) {
            __n = p_Var8[2]._M_nxt;
            pyVar10 = (this_00->val_pool).cur;
            if ((this_00->val_pool).end == pyVar10) {
              bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,alc,1);
              if (bVar3) {
                pyVar10 = pool->cur;
                goto LAB_00e5012a;
              }
              pyVar10 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_00e5012a:
              pool->cur = pyVar10 + 1;
            }
            pcVar6 = (this_00->str_pool).cur;
            if (__n < (_Hash_node_base *)((this_00->str_pool).end + -(long)pcVar6)) {
LAB_00e50148:
              pool_00->cur = pcVar6 + (long)((long)&__n->_M_nxt + 1);
              if (pcVar6 != (char *)0x0) {
                switchD_015de399::default(pcVar6,__src,(size_t)__n);
                pcVar6[(long)__n] = '\0';
                if (pyVar10 != (yyjson_mut_val *)0x0) {
                  pyVar10->tag = (long)__n << 8 | 5;
                  (pyVar10->uni).ptr = pcVar6;
                  goto LAB_00e50190;
                }
              }
            }
            else {
              bVar3 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                                (pool_00,alc,(usize)((long)&__n->_M_nxt + 1));
              if (bVar3) {
                pcVar6 = pool_00->cur;
                goto LAB_00e50148;
              }
            }
            pyVar10 = (yyjson_mut_val *)0x0;
          }
        }
LAB_00e50190:
        this_01 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
                  operator*((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                             *)(p_Var8 + 5));
        GetValueRecursive_abi_cxx11_(&local_50,this_01,child_00);
        __n_00 = local_50._M_string_length;
        __src_00._M_p = local_50._M_dataplus._M_p;
        pyVar5 = extraout_RDX_01;
        if (this_00 == (yyjson_mut_doc *)0x0) {
          pyVar9 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar9 = (yyjson_mut_val *)0x0;
          if ((ulong *)local_50._M_dataplus._M_p != (ulong *)0x0) {
            pyVar9 = (this_00->val_pool).cur;
            if ((this_00->val_pool).end == pyVar9) {
              bVar3 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,alc,1);
              pyVar5 = extraout_RDX_04;
              if (bVar3) {
                pyVar9 = pool->cur;
                goto LAB_00e501d2;
              }
              pyVar9 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_00e501d2:
              pool->cur = pyVar9 + 1;
            }
            pcVar6 = (this_00->str_pool).cur;
            if (__n_00 < (ulong)((long)(this_00->str_pool).end - (long)pcVar6)) {
LAB_00e501f5:
              pool_00->cur = pcVar6 + __n_00 + 1;
              if (pcVar6 != (char *)0x0) {
                switchD_015de399::default(pcVar6,__src_00._M_p,__n_00);
                pcVar6[__n_00] = '\0';
                pyVar5 = extraout_RDX_02;
                if (pyVar9 != (yyjson_mut_val *)0x0) {
                  pyVar9->tag = __n_00 << 8 | 5;
                  (pyVar9->uni).ptr = pcVar6;
                  goto LAB_00e5023e;
                }
              }
            }
            else {
              bVar3 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pool_00,alc,__n_00 + 1);
              pyVar5 = extraout_RDX_05;
              if (bVar3) {
                pcVar6 = pool_00->cur;
                goto LAB_00e501f5;
              }
            }
            pyVar9 = (yyjson_mut_val *)0x0;
          }
        }
LAB_00e5023e:
        if (((((ulong *)_Var7._M_p != (ulong *)0x0) &&
             (uVar1 = *(ulong *)_Var7._M_p, (~(uint)uVar1 & 7) == 0)) &&
            (pyVar10 != (yyjson_mut_val *)0x0)) &&
           (((pyVar10->tag & 7) == 5 && (pyVar9 != (yyjson_mut_val *)0x0)))) {
          pyVar4 = pyVar10;
          if (0xff < uVar1) {
            pyVar4 = *(yyjson_mut_val **)(*(long *)(*(ulong *)((long)_Var7._M_p + 8) + 0x10) + 0x10)
            ;
            *(yyjson_mut_val **)(*(long *)(*(ulong *)((long)_Var7._M_p + 8) + 0x10) + 0x10) =
                 pyVar10;
          }
          pyVar5 = (yyjson_mut_doc *)(uVar1 & 0xffffffffffffff00);
          pyVar9->next = pyVar4;
          pyVar10->next = pyVar9;
          *(yyjson_mut_val **)((long)_Var7._M_p + 8) = pyVar10;
          *(ulong *)_Var7._M_p = (long)&pyVar5[2].alc.realloc + (uVar1 & 0xff);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          pyVar5 = extraout_RDX_03;
        }
        p_Var8 = p_Var8->_M_nxt;
      } while (p_Var8 != (_Hash_node_base *)0x0);
    }
    WriteJsonToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)this_00,pyVar5);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->str_value)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->str_value)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string ComplexJSON::GetValueRecursive(const ComplexJSON &child) {
	if (child.is_object) {
		// We have to construct the nested json
		yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
		yyjson_mut_val *root = yyjson_mut_obj(doc);
		yyjson_mut_doc_set_root(doc, root);
		for (const auto &object : child.obj_value) {
			auto key = yyjson_mut_strncpy(doc, object.first.c_str(), object.first.size());
			auto value_str = GetValueRecursive(*object.second);
			auto value = yyjson_mut_strncpy(doc, value_str.c_str(), value_str.size());
			yyjson_mut_obj_add(root, key, value);
		}
		return WriteJsonToString(doc);
	} else {
		// simple string we can just write
		return child.str_value;
	}
}